

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCh2.cpp
# Opt level: O3

void __thiscall
presolve::dev_kkt_check::KktChStep::addChange
          (KktChStep *this,int type,HighsInt row,HighsInt col,double valC,double dualC,double dualR)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> upd;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_28;
  
  local_28.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(type) {
  case 1:
    lVar3 = *(long *)(this + 0x158);
    if (lVar3 == *(long *)(this + 0x160)) {
      lVar3 = *(long *)(*(long *)(this + 0x170) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x128));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x20);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x1a8);
    if (lVar3 == *(long *)(this + 0x1b0)) {
      lVar3 = *(long *)(*(long *)(this + 0x1c0) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x178));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x38);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x1f8);
    if (lVar3 == *(long *)(this + 0x200)) {
      lVar3 = *(long *)(*(long *)(this + 0x210) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x1c8));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0036767d:
      if (local_28.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
    }
    else {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 8);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    break;
  case 2:
    *(double *)(*(long *)(this + 8) + (long)col * 8) = dualR;
    return;
  case 3:
    if ((valC == 0.0) && (!NAN(valC))) {
      return;
    }
    lVar3 = *(long *)(this + 0xb8);
    if (lVar3 == *(long *)(this + 0xc0)) {
      lVar3 = *(long *)(*(long *)(this + 0xd0) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x88));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x50);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x108);
    if (lVar3 == *(long *)(this + 0x110)) {
      lVar3 = *(long *)(*(long *)(this + 0x120) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0xd8));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) goto LAB_0036767d;
    lVar2 = (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = *(long *)(this + 0x68);
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    pdVar1 = &(local_28.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    do {
      *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
      pdVar1 = pdVar1 + 2;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    break;
  case 4:
    lVar3 = *(long *)(this + 0x1f8);
    if (lVar3 == *(long *)(this + 0x200)) {
      lVar3 = *(long *)(*(long *)(this + 0x210) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x1c8));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) goto LAB_0036767d;
    lVar2 = (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = *(long *)(this + 8);
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    pdVar1 = &(local_28.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    do {
      *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
      pdVar1 = pdVar1 + 2;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    break;
  case 5:
    lVar3 = *(long *)(this + 0x158);
    if (lVar3 == *(long *)(this + 0x160)) {
      lVar3 = *(long *)(*(long *)(this + 0x170) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x128));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x20);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x1a8);
    if (lVar3 == *(long *)(this + 0x1b0)) {
      lVar3 = *(long *)(*(long *)(this + 0x1c0) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x178));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x38);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x1f8);
    if (lVar3 == *(long *)(this + 0x200)) {
      lVar3 = *(long *)(*(long *)(this + 0x210) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x1c8));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) goto LAB_0036767d;
    lVar2 = (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = *(long *)(this + 8);
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    pdVar1 = &(local_28.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    do {
      *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
      pdVar1 = pdVar1 + 2;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    break;
  case 6:
    if ((valC == 0.0) && (!NAN(valC))) {
      return;
    }
    lVar3 = *(long *)(this + 0xb8);
    if (lVar3 == *(long *)(this + 0xc0)) {
      lVar3 = *(long *)(*(long *)(this + 0xd0) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x88));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x50);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x108);
    if (lVar3 == *(long *)(this + 0x110)) {
      lVar3 = *(long *)(*(long *)(this + 0x120) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0xd8));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) goto LAB_0036767d;
    lVar2 = (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = *(long *)(this + 0x68);
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    pdVar1 = &(local_28.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    do {
      *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
      pdVar1 = pdVar1 + 2;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    break;
  case 7:
    if ((valC == 0.0) && (!NAN(valC))) {
      return;
    }
    lVar3 = *(long *)(this + 0xb8);
    if (lVar3 == *(long *)(this + 0xc0)) {
      lVar3 = *(long *)(*(long *)(this + 0xd0) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x88));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x50);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x108);
    if (lVar3 == *(long *)(this + 0x110)) {
      lVar3 = *(long *)(*(long *)(this + 0x120) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0xd8));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) goto LAB_0036767d;
    lVar2 = (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = *(long *)(this + 0x68);
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    pdVar1 = &(local_28.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    do {
      *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
      pdVar1 = pdVar1 + 2;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    break;
  case 8:
  case 9:
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    goto switchD_00366ae2_caseD_8;
  case 0xb:
    lVar3 = *(long *)(this + 0xb8);
    if (lVar3 == *(long *)(this + 0xc0)) {
      lVar3 = *(long *)(*(long *)(this + 0xd0) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x88));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x50);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x108);
    if (lVar3 == *(long *)(this + 0x110)) {
      lVar3 = *(long *)(*(long *)(this + 0x120) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0xd8));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) goto LAB_0036767d;
    lVar2 = (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = *(long *)(this + 0x68);
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    pdVar1 = &(local_28.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    do {
      *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
      pdVar1 = pdVar1 + 2;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    break;
  case 0xc:
    lVar3 = *(long *)(this + 0x158);
    if (lVar3 == *(long *)(this + 0x160)) {
      lVar3 = *(long *)(*(long *)(this + 0x170) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x128));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x20);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x1a8);
    if (lVar3 == *(long *)(this + 0x1b0)) {
      lVar3 = *(long *)(*(long *)(this + 0x1c0) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x178));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x38);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x1f8);
    if (lVar3 == *(long *)(this + 0x200)) {
      lVar3 = *(long *)(*(long *)(this + 0x210) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x1c8));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) goto LAB_0036767d;
    lVar2 = (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = *(long *)(this + 8);
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    pdVar1 = &(local_28.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    do {
      *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
      pdVar1 = pdVar1 + 2;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    break;
  case 0x11:
    lVar3 = *(long *)(this + 0x158);
    if (lVar3 == *(long *)(this + 0x160)) {
      lVar3 = *(long *)(*(long *)(this + 0x170) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x128));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x20);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x1a8);
    if (lVar3 == *(long *)(this + 0x1b0)) {
      lVar3 = *(long *)(*(long *)(this + 0x1c0) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x178));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x38);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x1f8);
    if (lVar3 == *(long *)(this + 0x200)) {
      lVar3 = *(long *)(*(long *)(this + 0x210) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x1c8));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) goto LAB_0036767d;
    lVar2 = (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = *(long *)(this + 8);
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    pdVar1 = &(local_28.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    do {
      *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
      pdVar1 = pdVar1 + 2;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    break;
  case 0x16:
    lVar3 = *(long *)(this + 0xb8);
    if (lVar3 == *(long *)(this + 0xc0)) {
      lVar3 = *(long *)(*(long *)(this + 0xd0) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x88));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x50);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x108);
    if (lVar3 == *(long *)(this + 0x110)) {
      lVar3 = *(long *)(*(long *)(this + 0x120) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0xd8));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) goto LAB_0036767d;
    lVar2 = (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = *(long *)(this + 0x68);
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    pdVar1 = &(local_28.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    do {
      *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
      pdVar1 = pdVar1 + 2;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    break;
  default:
    if (type != 0xab) {
      return;
    }
    lVar3 = *(long *)(this + 0xb8);
    if (lVar3 == *(long *)(this + 0xc0)) {
      lVar3 = *(long *)(*(long *)(this + 0xd0) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0x88));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar2 = (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar3 = *(long *)(this + 0x50);
      lVar2 = lVar2 + (ulong)(lVar2 == 0);
      pdVar1 = &(local_28.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
        pdVar1 = pdVar1 + 2;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    lVar3 = *(long *)(this + 0x108);
    if (lVar3 == *(long *)(this + 0x110)) {
      lVar3 = *(long *)(*(long *)(this + 0x120) + -8) + 0x1f8;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&local_28,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               (lVar3 + -0x18));
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back((deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                *)(this + 0xd8));
    if ((long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) goto LAB_0036767d;
    lVar2 = (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = *(long *)(this + 0x68);
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    pdVar1 = &(local_28.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    do {
      *(double *)(lVar3 + (long)((pair<int,_double> *)(pdVar1 + -1))->first * 8) = *pdVar1;
      pdVar1 = pdVar1 + 2;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  operator_delete(local_28.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
switchD_00366ae2_caseD_8:
  return;
}

Assistant:

void KktChStep::addChange(int type, HighsInt row, HighsInt col, double valC,
                          double dualC, double dualR) {
  // when updating fill new values for b, c, bounds in Rb RcolCost RcolUpper,
  // RcolLower
  vector<pair<HighsInt, double>> upd;

  switch (type) {
    case 171:  // new bounds from doubleton equation, retrieve old ones
      upd = rLowers.top();
      rLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RrowLower[ind] = get<1>(upd[i]);
      }
      upd = rUppers.top();
      rUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RrowUpper[ind] = get<1>(upd[i]);
      }
      break;
    case 1:  // row singleton
      upd = cLowers.top();
      cLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolLower[ind] = get<1>(upd[i]);
      }
      upd = cUppers.top();
      cUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolUpper[ind] = get<1>(upd[i]);
      }
      upd = costs.top();
      costs.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolCost[ind] = get<1>(upd[i]);
      }
      break;
    case 2:  // each variable at forcing row: rowDual is cost here
      RcolCost[col] = dualR;
      break;
    case 22:  //
      upd = rLowers.top();
      rLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RrowLower[ind] = get<1>(upd[i]);
      }
      upd = rUppers.top();
      rUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RrowUpper[ind] = get<1>(upd[i]);
      }
      break;
    case 3:  // the row that is forcing
      if (valC != 0) {
        upd = rLowers.top();
        rLowers.pop();
        for (size_t i = 0; i < upd.size(); i++) {
          HighsInt ind = get<0>(upd[i]);
          RrowLower[ind] = get<1>(upd[i]);
        }
        upd = rUppers.top();
        rUppers.pop();
        for (size_t i = 0; i < upd.size(); i++) {
          HighsInt ind = get<0>(upd[i]);
          RrowUpper[ind] = get<1>(upd[i]);
        }
      }
      break;
    case 4:  // implied free column singleton (also from duplicate row)
      upd = costs.top();
      costs.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolCost[ind] = get<1>(upd[i]);
      }
      break;
    case 5:  // doubleton eq with singleton col
      upd = cLowers.top();
      cLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolLower[ind] = get<1>(upd[i]);
      }
      upd = cUppers.top();
      cUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolUpper[ind] = get<1>(upd[i]);
      }
      upd = costs.top();
      costs.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolCost[ind] = get<1>(upd[i]);
      }
      break;
    case 17: {  // doubleton equation
      upd = cLowers.top();
      cLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolLower[ind] = get<1>(upd[i]);
      }
      upd = cUppers.top();
      cUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolUpper[ind] = get<1>(upd[i]);
      }
      upd = costs.top();
      costs.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolCost[ind] = get<1>(upd[i]);
      }
      break;
    }
    case 6:  // empty column, dominated column or weakly dominated
      if (valC != 0) {
        upd = rLowers.top();
        rLowers.pop();
        for (size_t i = 0; i < upd.size(); i++) {
          HighsInt ind = get<0>(upd[i]);
          RrowLower[ind] = get<1>(upd[i]);
        }
        upd = rUppers.top();
        rUppers.pop();
        for (size_t i = 0; i < upd.size(); i++) {
          HighsInt ind = get<0>(upd[i]);
          RrowUpper[ind] = get<1>(upd[i]);
        }
      }
      break;
    case 7:  // fixed variable
      if (valC != 0) {
        upd = rLowers.top();
        rLowers.pop();
        for (size_t i = 0; i < upd.size(); i++) {
          HighsInt ind = get<0>(upd[i]);
          RrowLower[ind] = get<1>(upd[i]);
        }
        upd = rUppers.top();
        rUppers.pop();
        for (size_t i = 0; i < upd.size(); i++) {
          HighsInt ind = get<0>(upd[i]);
          RrowUpper[ind] = get<1>(upd[i]);
        }
      }
      break;
    case 11:  // empty row from duplicate rows
      upd = rLowers.top();
      rLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RrowLower[ind] = get<1>(upd[i]);
      }
      upd = rUppers.top();
      rUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RrowUpper[ind] = get<1>(upd[i]);
      }
      break;
    case 12:  // doubleton eq from duplicate rows;
      upd = cLowers.top();
      cLowers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolLower[ind] = get<1>(upd[i]);
      }
      upd = cUppers.top();
      cUppers.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolUpper[ind] = get<1>(upd[i]);
      }
      upd = costs.top();
      costs.pop();
      for (size_t i = 0; i < upd.size(); i++) {
        HighsInt ind = get<0>(upd[i]);
        RcolCost[ind] = get<1>(upd[i]);
      }
      break;
    case 121:  //
      break;   /*
  case 14: //two duplicate columns by one
         colValue[col] = valC;
         colDual[col] = dualC;
         RcolLower = cLowers.top(); cLowers.pop();
         RcolUpper = cUppers.top(); cUppers.pop();
         break;
  case 15: //sing variable on initEq
         flagRow[row] = true;
         rowDual[row] = dualR;
         break;*/
  }
}